

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinHypot
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  pointer pVVar1;
  allocator_type *in_RCX;
  double v;
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  Value VVar2;
  allocator<char> local_59;
  _Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  local_58;
  string local_40;
  Type local_20 [2];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"hypot",&local_59);
  local_20[0] = NUMBER;
  local_20[1] = NUMBER;
  __l._M_len = 2;
  __l._M_array = local_20;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
            *)&local_58,__l,in_RCX);
  validateBuiltinArgs(this,loc,&local_40,args,
                      (vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                       *)&local_58);
  std::
  _Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::~_Vector_base(&local_58);
  std::__cxx11::string::~string((string *)&local_40);
  pVVar1 = (args->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           )._M_impl.super__Vector_impl_data._M_start;
  v = hypot((pVVar1->v).d,pVVar1[1].v.d);
  VVar2 = makeNumberCheck(this,loc,v);
  (this->scratch).t = NUMBER;
  (this->scratch).v = VVar2._0_8_;
  return (AST *)0x0;
}

Assistant:

const AST *builtinHypot(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "hypot", args, {Value::NUMBER, Value::NUMBER});
        scratch = makeNumberCheck(loc, std::hypot(args[0].v.d, args[1].v.d));
        return nullptr;
    }